

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O3

bool __thiscall create::Serial::startReading(Serial *this)

{
  mutex *__mutex;
  impl_type *piVar1;
  reactor *prVar2;
  byte bVar3;
  int iVar4;
  cv_status cVar5;
  long lVar6;
  size_t in_RCX;
  transfer_all_t *completion_cond;
  int in_R8D;
  bool bVar7;
  uint8_t oc;
  unique_lock<std::mutex> lock;
  transfer_all_t local_79;
  undefined1 local_78 [8];
  undefined8 local_70;
  _Head_base<0UL,_boost::asio::io_context_*,_false> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  unique_lock<std::mutex> local_58;
  undefined1 local_48 [8];
  epoll_data_t eStack_40;
  serial_port *local_38;
  
  if ((this->port).impl_.implementation_.descriptor_ != -1) {
    if ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[create::Serial] ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"data pointer not initialized.",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
    }
    else {
      if (this->isReading != false) {
        return true;
      }
      local_78[0] = 0x80;
      send(this,(int)local_78,(void *)0x1,in_RCX,in_R8D);
      iVar4 = (**this->_vptr_Serial)(this);
      if ((char)iVar4 != '\0') {
        piVar1 = (this->io).impl_;
        if ((piVar1->mutex_).enabled_ == false) {
          piVar1->stopped_ = false;
        }
        else {
          __mutex = &(piVar1->mutex_).mutex_;
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          piVar1->stopped_ = false;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        local_58._M_device = (mutex_type *)&this->byteRead;
        local_58._8_8_ = 1;
        std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<create::Serial,void>
                  ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)local_48,
                   (__weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<create::Serial>);
        local_78 = (undefined1  [8])onData;
        local_70 = 0;
        _Stack_60._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(eStack_40.u64._4_4_,eStack_40.fd);
        local_48._0_4_ = 0;
        local_48._4_4_ = 0;
        eStack_40.fd = 0;
        eStack_40.u64._4_4_ = 0;
        local_38 = &this->port;
        completion_cond = &local_79;
        boost::asio::detail::
        initiate_async_read_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
        ::operator()((initiate_async_read_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                      *)&local_38,
                     (_Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
                      *)local_78,(mutable_buffers_1 *)&local_58,completion_cond);
        if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(eStack_40.u64._4_4_,eStack_40.fd) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(eStack_40.u64._4_4_,eStack_40.fd));
        }
        local_78 = (undefined1  [8])boost::asio::io_context::run;
        local_70 = 0;
        local_68._M_head_impl = &this->io;
        std::thread::
        thread<std::_Bind<unsigned_long(boost::asio::io_context::*(boost::asio::io_context*))()>,,void>
                  ((thread *)&local_58,
                   (_Bind<unsigned_long_(boost::asio::io_context::*(boost::asio::io_context_*))()> *
                   )local_78);
        if ((this->ioThread)._M_id._M_thread != 0) {
          std::terminate();
        }
        (this->ioThread)._M_id._M_thread = (native_handle_type)local_58._M_device;
        local_58._M_device = &this->dataReadyMut;
        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock(&local_58);
        local_58._M_owns = true;
        if (this->dataReady == false) {
          iVar4 = 1;
          do {
            lVar6 = std::chrono::_V2::steady_clock::now();
            local_78 = (undefined1  [8])(lVar6 + 500000000);
            cVar5 = std::condition_variable::
                    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                              (&this->dataReadyCond,&local_58,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)local_78);
            if (cVar5 == timeout) {
              if (9 < iVar4) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"[create::Serial] ",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "failed to receive data from Create. Check if robot is powered!",0x3e);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
                std::ostream::put('x');
                std::ostream::flush();
                piVar1 = (this->io).impl_;
                local_78 = (undefined1  [8])&piVar1->mutex_;
                bVar3 = (piVar1->mutex_).enabled_;
                bVar7 = (bool)bVar3 == true;
                if (bVar7) {
                  pthread_mutex_lock((pthread_mutex_t *)&(piVar1->mutex_).mutex_);
                  bVar3 = (piVar1->mutex_).enabled_;
                }
                local_70._0_1_ = bVar7;
                piVar1->stopped_ = true;
                if ((bVar3 & 1) != 0) {
                  boost::asio::detail::posix_event::
                  signal_all<boost::asio::detail::conditionally_enabled_mutex::scoped_lock>
                            (&(piVar1->wakeup_event_).event_,(scoped_lock *)local_78);
                }
                unique0x10000629 = (select_interrupter *)CONCAT44(eStack_40.fd,local_48._4_4_);
                if ((piVar1->task_interrupted_ == false) &&
                   (prVar2 = piVar1->task_,
                   unique0x10000631 = (select_interrupter *)CONCAT44(eStack_40.fd,local_48._4_4_),
                   prVar2 != (reactor *)0x0)) {
                  piVar1->task_interrupted_ = true;
                  local_48._0_4_ = 0x80000009;
                  unique0x00004780 = &prVar2->interrupter_;
                  epoll_ctl(prVar2->epoll_fd_,3,(prVar2->interrupter_).read_descriptor_,
                            (epoll_event *)local_48);
                }
                if (local_70._0_1_ == true) {
                  pthread_mutex_unlock((pthread_mutex_t *)((long)local_78 + 8));
                }
                std::thread::join();
                bVar7 = false;
                goto LAB_001369bc;
              }
              local_78[0] = 0x80;
              send(this,(int)(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)local_78,(void *)0x1,(size_t)completion_cond,in_R8D);
              (**this->_vptr_Serial)(this);
              iVar4 = iVar4 + 1;
            }
          } while (this->dataReady != true);
        }
        this->isReading = true;
        bVar7 = true;
LAB_001369bc:
        std::unique_lock<std::mutex>::~unique_lock(&local_58);
        return bVar7;
      }
    }
  }
  return false;
}

Assistant:

bool Serial::startReading() {
    if (!connected()) return false;

    if (!data) {
      CERR("[create::Serial] ", "data pointer not initialized.");
      return false;
    }

    // Only allow once
    if (isReading) return true;

    // Start OI
    sendOpcode(OC_START);

    if (!startSensorStream()) return false;

    io.reset();

    // Start continuously reading one byte at a time
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));

    ioThread = std::thread(std::bind(
        static_cast<std::size_t(boost::asio::io_service::*)(void)>(
          &boost::asio::io_service::run), &io));

    // Wait for first complete read to finish
    std::unique_lock<std::mutex> lock(dataReadyMut);

    int attempts = 1;
    int maxAttempts = 10;
    while (!dataReady) {
      if (dataReadyCond.wait_for(lock, std::chrono::milliseconds(500)) == std::cv_status::timeout) {
        if (attempts >= maxAttempts) {
          CERR("[create::Serial] ", "failed to receive data from Create. Check if robot is powered!");
          io.stop();
          ioThread.join();
          return false;
        }
        attempts++;

        // Request data again
        sendOpcode(OC_START);
        startSensorStream();
      }
    }

    isReading = true;
    return true;
  }